

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O1

void __thiscall Assimp::B3DImporter::ReadMESH(B3DImporter *this)

{
  pointer pVVar1;
  pointer pVVar2;
  pointer puVar3;
  int iVar4;
  string t;
  string local_50;
  
  ReadInt(this);
  if ((this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish[-1] != this->_pos) {
    pVVar1 = (this->_vertices).
             super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pVVar2 = (this->_vertices).
             super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      ReadChunk_abi_cxx11_(&local_50,this);
      iVar4 = std::__cxx11::string::compare((char *)&local_50);
      if (iVar4 == 0) {
        ReadVRTS(this);
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)&local_50);
        if (iVar4 == 0) {
          ReadTRIS(this,(int)((ulong)((long)pVVar1 - (long)pVVar2) >> 3) * -0x49249249);
        }
      }
      puVar3 = (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      this->_pos = puVar3[-1];
      (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar3 + -1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    } while ((this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish[-1] != this->_pos);
  }
  return;
}

Assistant:

void B3DImporter::ReadMESH(){
    /*int matid=*/ReadInt();

    int v0= static_cast<int>(_vertices.size());

    while( ChunkSize() ){
        string t=ReadChunk();
        if( t=="VRTS" ){
            ReadVRTS();
        }else if( t=="TRIS" ){
            ReadTRIS( v0 );
        }
        ExitChunk();
    }
}